

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O2

void __thiscall OPNMIDIplay::noteOff(OPNMIDIplay *this,size_t midCh,uint8_t note,bool forceNow)

{
  notes_iterator i;
  undefined7 in_register_00000011;
  
  i = MIDIchannel::find_activenote
                ((this->m_midiChannels).
                 super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                 ._M_impl.super__Vector_impl_data._M_start + midCh,
                 (uint)CONCAT71(in_register_00000011,note));
  if (((i.cell_)->super_pl_basic_cell<OPNMIDIplay::MIDIchannel::NoteInfo>).next !=
      (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)0x0) {
    if ((forceNow) || (((i.cell_)->value).ttl <= 0.0)) {
      noteUpdate(this,midCh,i,0x20,-1);
      return;
    }
    ((i.cell_)->value).isOnExtendedLifeTime = true;
  }
  return;
}

Assistant:

void OPNMIDIplay::noteOff(size_t midCh, uint8_t note, bool forceNow)
{
    MIDIchannel &ch = m_midiChannels[midCh];
    MIDIchannel::notes_iterator i = ch.find_activenote(note);

    if(!i.is_end())
    {
        MIDIchannel::NoteInfo &ni = i->value;
        if(forceNow || ni.ttl <= 0)
            noteUpdate(midCh, i, Upd_Off);
        else
            ni.isOnExtendedLifeTime = true;
    }
}